

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_tests.cpp
# Opt level: O2

void ClearCounter(void)

{
  g_foo_bar = 0;
  g_hoge_fuga = 0;
  g_environment_setup = 0;
  g_environment_teardown = 0;
  g_param_test = 0;
  return;
}

Assistant:

void ClearCounter(void)
{
    g_foo_bar = 0;
    g_hoge_fuga = 0;
    g_environment_setup = 0;
    g_environment_teardown = 0;
#if IUTEST_HAS_PARAM_TEST
    g_param_test = 0;
#endif
}